

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.hpp
# Opt level: O1

void __thiscall lightconf::scanner::skip_whitespace(scanner *this,bool ignore_comments)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer ptVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pcVar6;
  undefined4 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined7 in_register_00000031;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  bool bVar14;
  token tok;
  token tok_1;
  token_type local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  double local_98;
  uint uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_7c;
  _Any_data *local_78;
  token_type local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  double local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  
  local_7c = (undefined4)CONCAT71(in_register_00000031,ignore_comments);
  local_78 = (_Any_data *)&this->params_;
  do {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    uVar12 = (ulong)this->cur_token_;
    ptVar5 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)ptVar5 >> 6 == uVar12) {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98 = 0.0;
      uStack_90 = uStack_90 & 0xffffff00;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      local_c0 = eof_token;
    }
    else {
      local_c0 = ptVar5[uVar12].type;
      pcVar6 = ptVar5[uVar12].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar6,pcVar6 + ptVar5[uVar12].string_value._M_string_length);
      uVar1 = ptVar5[uVar12].line;
      uVar7 = ptVar5[uVar12].col;
      local_98 = ptVar5[uVar12].number_value;
      uVar11 = (&ptVar5[uVar12].number_value)[1];
      uStack_90 = (uint)uVar11;
      uStack_8c = (undefined4)((ulong)uVar11 >> 0x20);
      uStack_88 = uVar1;
      uStack_84 = uVar7;
    }
    bVar14 = true;
    if (local_c0 != whitespace_token) {
      uVar12 = (ulong)this->cur_token_;
      ptVar5 = (this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ptVar5 >> 6 == uVar12) {
        local_68 = local_58;
        local_60 = 0;
        local_58[0] = 0;
        local_48 = 0.0;
        uStack_40 = uStack_40 & 0xffffff00;
        uStack_3c = 0;
        uStack_38 = 0;
        local_34 = 0;
        local_70 = eof_token;
      }
      else {
        local_70 = ptVar5[uVar12].type;
        local_68 = local_58;
        pcVar6 = ptVar5[uVar12].string_value._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar6,pcVar6 + ptVar5[uVar12].string_value._M_string_length)
        ;
        uVar2 = ptVar5[uVar12].line;
        uVar8 = ptVar5[uVar12].col;
        local_48 = ptVar5[uVar12].number_value;
        ptVar5 = ptVar5 + uVar12;
        uVar11._0_1_ = ptVar5->char_value;
        uVar11._1_3_ = *(undefined3 *)&ptVar5->field_0x31;
        uVar11._4_4_ = ptVar5->pos;
        uStack_40 = (uint)uVar11;
        uStack_3c = uVar11._4_4_;
        uStack_38 = uVar2;
        local_34 = uVar8;
      }
      bVar14 = local_70 == comment_token;
    }
    paVar13 = &local_b8.field_2;
    if ((local_c0 != whitespace_token) && (local_68 != local_58)) {
      operator_delete(local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar13) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (!bVar14) {
      return;
    }
    uVar12 = (ulong)this->cur_token_;
    ptVar5 = (this->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8._M_dataplus._M_p = (pointer)paVar13;
    if ((long)(this->tokens_).
              super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)ptVar5 >> 6 == uVar12) {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_98 = 0.0;
      uStack_90 = uStack_90 & 0xffffff00;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      local_c0 = eof_token;
    }
    else {
      local_c0 = ptVar5[uVar12].type;
      pcVar6 = ptVar5[uVar12].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar6,pcVar6 + ptVar5[uVar12].string_value._M_string_length);
      uVar3 = ptVar5[uVar12].line;
      uVar9 = ptVar5[uVar12].col;
      local_98 = ptVar5[uVar12].number_value;
      uVar11 = (&ptVar5[uVar12].number_value)[1];
      uStack_90 = (uint)uVar11;
      uStack_8c = (undefined4)((ulong)uVar11 >> 0x20);
      uStack_88 = uVar3;
      uStack_84 = uVar9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar13) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((this->params_).comment_function.super__Function_base._M_manager != (_Manager_type)0x0 &&
        (local_c0 == comment_token && (char)local_7c == '\0')) {
      uVar12 = (ulong)this->cur_token_;
      ptVar5 = (this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(this->tokens_).
                super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ptVar5 >> 6 == uVar12) {
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_98 = 0.0;
        uStack_90 = uStack_90 & 0xffffff00;
        uStack_8c = 0;
        uStack_88 = 0;
        uStack_84 = 0;
        local_b8._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        pcVar6 = ptVar5[uVar12].string_value._M_dataplus._M_p;
        local_b8._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar6,pcVar6 + ptVar5[uVar12].string_value._M_string_length)
        ;
        uVar4 = ptVar5[uVar12].line;
        uVar10 = ptVar5[uVar12].col;
        local_98 = ptVar5[uVar12].number_value;
        uVar11 = (&ptVar5[uVar12].number_value)[1];
        uStack_90 = (uint)uVar11;
        uStack_8c = (undefined4)((ulong)uVar11 >> 0x20);
        uStack_88 = uVar4;
        uStack_84 = uVar10;
      }
      if ((this->params_).comment_function.super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar11 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        _Unwind_Resume(uVar11);
      }
      (*(this->params_).comment_function._M_invoker)(local_78,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar13) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    if ((ulong)this->cur_token_ <=
        ((long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start >> 6) - 1U) {
      this->cur_token_ = this->cur_token_ + 1;
    }
  } while( true );
}

Assistant:

inline void scanner::skip_whitespace(bool ignore_comments) {
    while (cur_token().type == token_type::whitespace_token || cur_token().type == token_type::comment_token) {
        if (cur_token().type == token_type::comment_token && !ignore_comments) {
            if (params_.comment_function) {
                params_.comment_function(cur_token().string_value);
            }
        }
        next_token();
    }
}